

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O3

FT_Error FT_Stroker_CubicTo(FT_Stroker stroker,FT_Vector *control1,FT_Vector *control2,FT_Vector *to
                           )

{
  FT_Vector *pFVar1;
  long lVar2;
  long lVar3;
  FT_Pos FVar4;
  bool bVar5;
  int iVar6;
  FT_Error FVar7;
  FT_Angle angle1;
  FT_Angle FVar8;
  FT_Angle angle2;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  FT_Angle FVar12;
  FT_Angle FVar13;
  FT_Angle FVar14;
  FT_Angle FVar15;
  FT_Fixed FVar16;
  FT_Long length;
  FT_Long FVar17;
  FT_Angle FVar18;
  FT_Fixed FVar19;
  FT_Long length_00;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long dx;
  long lVar23;
  long lVar24;
  long lVar25;
  long dx_00;
  long dy;
  long dy_00;
  FT_StrokeBorder border;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  FT_Pos FStack_378;
  FT_Vector bez_stack [37];
  FT_Vector bvec;
  FT_Vector delta;
  undefined1 auStack_f8 [8];
  FT_Vector start;
  undefined1 local_e0 [8];
  FT_Vector ctrl1;
  FT_Vector ctrl2;
  FT_Angle local_88;
  undefined1 local_78 [8];
  FT_Vector end;
  FT_Pos *local_48;
  
  FVar7 = 6;
  if ((to != (FT_Vector *)0x0 && control2 != (FT_Vector *)0x0) &&
      (control1 != (FT_Vector *)0x0 && stroker != (FT_Stroker)0x0)) {
    pFVar1 = &stroker->center;
    if (((((2 < ((stroker->center).x - control1->x) + 1U) ||
          (2 < ((stroker->center).y - control1->y) + 1U)) || (2 < (control1->x - control2->x) + 1U))
        || ((2 < (control1->y - control2->y) + 1U || (2 < (control2->x - to->x) + 1U)))) ||
       (2 < (control2->y - to->y) + 1U)) {
      local_48 = &FStack_378;
      FStack_378 = to->x;
      bez_stack[0].x = to->y;
      bez_stack[0].y = control2->x;
      bez_stack[1].x = control2->y;
      bez_stack[1].y = control1->x;
      bez_stack[2].x = control1->y;
      bez_stack[2].y = pFVar1->x;
      bez_stack[3].x = (stroker->center).y;
      bVar5 = true;
      end.y = 0;
      do {
        angle1 = stroker->angle_in;
        angle2 = angle1;
        FVar8 = angle1;
        if ((ulong)end.y < 0x200) {
          lVar21 = local_48[4];
          lVar23 = local_48[6];
          lVar22 = local_48[5];
          lVar25 = local_48[7];
          lVar2 = local_48[1];
          lVar24 = local_48[2];
          dx = lVar24 - lVar21;
          lVar3 = local_48[3];
          dy_00 = lVar3 - lVar22;
          lVar11 = *(long *)((long)bez_stack + (end.y - 8U));
          dx_00 = lVar11 - lVar24;
          dy = lVar2 - lVar3;
          bVar26 = 2 < dx + 1U;
          bVar27 = 2 < dy_00 + 1U;
          bVar28 = 2 < dx_00 + 1U;
          bVar29 = 2 < dy + 1U;
          if ((lVar22 - lVar25) + 1U < 3 && (lVar21 - lVar23) + 1U < 3) {
            if (bVar27 || bVar26) {
              angle1 = FT_Atan2(dx,dy_00);
              angle2 = angle1;
              FVar8 = angle1;
              if (bVar29 || bVar28) {
                angle2 = FT_Atan2(dx_00,dy);
              }
            }
            else if (bVar29 || bVar28) {
              angle1 = FT_Atan2(dx_00,dy);
              angle2 = angle1;
              FVar8 = angle1;
            }
          }
          else {
            angle1 = FT_Atan2(lVar21 - lVar23,lVar22 - lVar25);
            if (bVar27 || bVar26) {
              FVar8 = FT_Atan2(dx,dy_00);
              angle2 = FVar8;
              if (bVar29 || bVar28) {
                angle2 = FT_Atan2(dx_00,dy);
              }
            }
            else {
              angle2 = angle1;
              FVar8 = angle1;
              if (bVar29 || bVar28) {
                angle2 = FT_Atan2(dx_00,dy);
                FVar8 = FT_Angle_Diff(angle1,angle2);
                FVar8 = FVar8 / 2 + angle1;
              }
            }
          }
          uVar9 = FT_Angle_Diff(angle1,FVar8);
          uVar20 = -uVar9;
          if (0 < (long)uVar9) {
            uVar20 = uVar9;
          }
          uVar10 = FT_Angle_Diff(FVar8,angle2);
          uVar9 = -uVar10;
          if (0 < (long)uVar10) {
            uVar9 = uVar10;
          }
          if ((uVar20 < 0x168000) && (uVar9 < 0x168000)) goto LAB_001f410b;
          if (stroker->first_point != '\0') {
            stroker->angle_in = angle1;
          }
          local_48[0xc] = lVar23;
          lVar11 = (lVar11 + lVar24) / 2;
          local_48[2] = lVar11;
          lVar23 = (lVar23 + lVar21) / 2;
          local_48[10] = lVar23;
          lVar21 = (lVar24 + lVar21) / 2;
          lVar24 = (lVar11 + lVar21) / 2;
          local_48[4] = lVar24;
          lVar21 = (lVar21 + lVar23) / 2;
          local_48[8] = lVar21;
          local_48[6] = (lVar21 + lVar24) / 2;
          local_48[0xd] = lVar25;
          lVar21 = (lVar2 + lVar3) / 2;
          local_48[3] = lVar21;
          lVar23 = (lVar25 + lVar22) / 2;
          local_48[0xb] = lVar23;
          lVar22 = (lVar3 + lVar22) / 2;
          lVar25 = (lVar21 + lVar22) / 2;
          local_48[5] = lVar25;
          lVar21 = (lVar22 + lVar23) / 2;
          local_48[9] = lVar21;
          local_48[7] = (lVar21 + lVar25) / 2;
          end.y = end.y + 0x30;
        }
        else {
LAB_001f410b:
          if (bVar5) {
            if (stroker->first_point == '\0') {
              stroker->angle_out = angle1;
              iVar6 = ft_stroker_process_corner(stroker,0);
            }
            else {
              iVar6 = ft_stroker_subpath_start(stroker,angle1,0);
            }
LAB_001f42d5:
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          else {
            uVar9 = FT_Angle_Diff(stroker->angle_in,angle1);
            uVar20 = -uVar9;
            if (0 < (long)uVar9) {
              uVar20 = uVar9;
            }
            if (0x5a000 < uVar20) {
              FVar4 = local_48[7];
              pFVar1->x = local_48[6];
              (stroker->center).y = FVar4;
              stroker->angle_out = angle1;
              stroker->line_join = FT_STROKER_LINEJOIN_ROUND;
              iVar6 = ft_stroker_process_corner(stroker,0);
              stroker->line_join = stroker->line_join_saved;
              goto LAB_001f42d5;
            }
          }
          FVar12 = FT_Angle_Diff(angle1,FVar8);
          FVar13 = FT_Angle_Diff(FVar8,angle2);
          FVar14 = FT_Angle_Diff(angle1,FVar8);
          FVar15 = FT_Angle_Diff(FVar8,angle2);
          FVar17 = stroker->radius;
          FVar16 = FT_Cos(FVar12 / 2);
          length = FT_DivFix(FVar17,FVar16);
          FVar17 = stroker->radius;
          FVar16 = FT_Cos(FVar13 / 2);
          FVar17 = FT_DivFix(FVar17,FVar16);
          lVar21 = end.y;
          if (stroker->handle_wide_strokes == '\0') {
            local_88 = 0;
          }
          else {
            local_88 = FT_Atan2(*(long *)((long)bez_stack + end.y + -8) - local_48[6],
                                local_48[1] - local_48[7]);
          }
          lVar23 = 0x5a0000;
          border = stroker->borders;
          bVar5 = true;
          do {
            bVar26 = bVar5;
            FT_Vector_From_Polar((FT_Vector *)local_e0,length,FVar14 / 2 + angle1 + lVar23);
            local_e0 = (undefined1  [8])((long)local_e0 + local_48[4]);
            ctrl1.x = ctrl1.x + local_48[5];
            FT_Vector_From_Polar((FT_Vector *)&ctrl1.y,FVar17,FVar15 / 2 + FVar8 + lVar23);
            ctrl1.y = ctrl1.y + local_48[2];
            FT_Vector_From_Polar((FT_Vector *)local_78,stroker->radius,lVar23 + angle2);
            lVar23 = *(long *)((long)bez_stack + lVar21 + -8);
            local_78 = (undefined1  [8])((long)local_78 + lVar23);
            lVar22 = local_48[1];
            end.x = end.x + lVar22;
            if (stroker->handle_wide_strokes == '\0') {
LAB_001f4674:
              iVar6 = ft_stroke_border_cubicto
                                (border,(FT_Vector *)local_e0,(FT_Vector *)&ctrl1.y,
                                 (FT_Vector *)local_78);
            }
            else {
              lVar25 = border->points[border->num_points - 1].x;
              lVar2 = border->points[border->num_points - 1].y;
              auStack_f8 = (undefined1  [8])lVar25;
              start.x = lVar2;
              FVar12 = FT_Atan2((long)local_78 - lVar25,end.x - lVar2);
              uVar9 = FT_Angle_Diff(local_88,FVar12);
              uVar20 = -uVar9;
              if (0 < (long)uVar9) {
                uVar20 = uVar9;
              }
              lVar21 = end.y;
              if (uVar20 < 0x5a0001) goto LAB_001f4674;
              FVar13 = FT_Atan2(local_48[6] - lVar25,local_48[7] - lVar2);
              FVar18 = FT_Atan2(lVar23 - (long)local_78,lVar22 - end.x);
              bez_stack[0x24].y = (long)local_78 - lVar25;
              bvec.x = end.x - lVar2;
              FVar16 = FT_Vector_Length((FT_Vector *)&bez_stack[0x24].y);
              FVar19 = FT_Sin(FVar12 - FVar18);
              lVar21 = -FVar19;
              if (0 < FVar19) {
                lVar21 = FVar19;
              }
              FVar19 = FT_Sin(FVar13 - FVar18);
              lVar23 = -FVar19;
              if (0 < FVar19) {
                lVar23 = FVar19;
              }
              length_00 = FT_MulDiv(FVar16,lVar21,lVar23);
              FT_Vector_From_Polar((FT_Vector *)&bvec.y,length_00,FVar13);
              bvec.y = bvec.y + lVar25;
              border->movable = '\0';
              FVar7 = ft_stroke_border_lineto(border,(FT_Vector *)&bvec.y,'\0');
              if (FVar7 != 0) {
                return FVar7;
              }
              FVar7 = ft_stroke_border_lineto(border,(FT_Vector *)local_78,'\0');
              if (FVar7 != 0) {
                return FVar7;
              }
              FVar7 = ft_stroke_border_cubicto
                                (border,(FT_Vector *)&ctrl1.y,(FT_Vector *)local_e0,
                                 (FT_Vector *)auStack_f8);
              if (FVar7 != 0) {
                return FVar7;
              }
              iVar6 = ft_stroke_border_lineto(border,(FT_Vector *)local_78,'\0');
              lVar21 = end.y;
            }
            if (iVar6 != 0) {
              return iVar6;
            }
            border = border + 1;
            lVar23 = -0x5a0000;
            bVar5 = false;
          } while (bVar26);
          end.y = lVar21 - 0x30;
          stroker->angle_in = angle2;
          bVar5 = false;
        }
        local_48 = (FT_Pos *)((long)bez_stack + (end.y - 8U));
      } while (-1 < end.y);
    }
    FVar4 = to->y;
    pFVar1->x = to->x;
    (stroker->center).y = FVar4;
    FVar7 = 0;
  }
  return FVar7;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_CubicTo( FT_Stroker  stroker,
                      FT_Vector*  control1,
                      FT_Vector*  control2,
                      FT_Vector*  to )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Vector   bez_stack[37];
    FT_Vector*  arc;
    FT_Vector*  limit = bez_stack + 32;
    FT_Bool     first_arc = TRUE;


    if ( !stroker || !control1 || !control2 || !to )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if ( FT_IS_SMALL( stroker->center.x - control1->x ) &&
         FT_IS_SMALL( stroker->center.y - control1->y ) &&
         FT_IS_SMALL( control1->x       - control2->x ) &&
         FT_IS_SMALL( control1->y       - control2->y ) &&
         FT_IS_SMALL( control2->x       - to->x       ) &&
         FT_IS_SMALL( control2->y       - to->y       ) )
    {
       stroker->center = *to;
       goto Exit;
    }

    arc    = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while ( arc >= bez_stack )
    {
      FT_Angle  angle_in, angle_mid, angle_out;


      /* initialize with current direction */
      angle_in = angle_out = angle_mid = stroker->angle_in;

      if ( arc < limit                                         &&
           !ft_cubic_is_small_enough( arc, &angle_in,
                                      &angle_mid, &angle_out ) )
      {
        if ( stroker->first_point )
          stroker->angle_in = angle_in;

        ft_cubic_split( arc );
        arc += 3;
        continue;
      }

      if ( first_arc )
      {
        first_arc = FALSE;

        /* process corner if necessary */
        if ( stroker->first_point )
          error = ft_stroker_subpath_start( stroker, angle_in, 0 );
        else
        {
          stroker->angle_out = angle_in;
          error = ft_stroker_process_corner( stroker, 0 );
        }
      }
      else if ( ft_pos_abs( FT_Angle_Diff( stroker->angle_in, angle_in ) ) >
                  FT_SMALL_CUBIC_THRESHOLD / 4                             )
      {
        /* if the deviation from one arc to the next is too great, */
        /* add a round corner                                      */
        stroker->center    = arc[3];
        stroker->angle_out = angle_in;
        stroker->line_join = FT_STROKER_LINEJOIN_ROUND;

        error = ft_stroker_process_corner( stroker, 0 );

        /* reinstate line join style */
        stroker->line_join = stroker->line_join_saved;
      }

      if ( error )
        goto Exit;

      /* the arc's angle is small enough; we can add it directly to each */
      /* border                                                          */
      {
        FT_Vector        ctrl1, ctrl2, end;
        FT_Angle         theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
        FT_Fixed         length1, length2;
        FT_StrokeBorder  border;
        FT_Int           side;


        theta1  = FT_Angle_Diff( angle_in,  angle_mid ) / 2;
        theta2  = FT_Angle_Diff( angle_mid, angle_out ) / 2;
        phi1    = ft_angle_mean( angle_in,  angle_mid );
        phi2    = ft_angle_mean( angle_mid, angle_out );
        length1 = FT_DivFix( stroker->radius, FT_Cos( theta1 ) );
        length2 = FT_DivFix( stroker->radius, FT_Cos( theta2 ) );

        /* compute direction of original arc */
        if ( stroker->handle_wide_strokes )
          alpha0 = FT_Atan2( arc[0].x - arc[3].x, arc[0].y - arc[3].y );

        for ( border = stroker->borders, side = 0;
              side <= 1;
              side++, border++ )
        {
          rotate = FT_SIDE_TO_ROTATE( side );

          /* compute control points */
          FT_Vector_From_Polar( &ctrl1, length1, phi1 + rotate );
          ctrl1.x += arc[2].x;
          ctrl1.y += arc[2].y;

          FT_Vector_From_Polar( &ctrl2, length2, phi2 + rotate );
          ctrl2.x += arc[1].x;
          ctrl2.y += arc[1].y;

          /* compute end point */
          FT_Vector_From_Polar( &end, stroker->radius, angle_out + rotate );
          end.x += arc[0].x;
          end.y += arc[0].y;

          if ( stroker->handle_wide_strokes )
          {
            FT_Vector  start;
            FT_Angle   alpha1;


            /* determine whether the border radius is greater than the */
            /* radius of curvature of the original arc                 */
            start = border->points[border->num_points - 1];

            alpha1 = FT_Atan2( end.x - start.x, end.y - start.y );

            /* is the direction of the border arc opposite to */
            /* that of the original arc? */
            if ( ft_pos_abs( FT_Angle_Diff( alpha0, alpha1 ) ) >
                   FT_ANGLE_PI / 2                             )
            {
              FT_Angle   beta, gamma;
              FT_Vector  bvec, delta;
              FT_Fixed   blen, sinA, sinB, alen;


              /* use the sine rule to find the intersection point */
              beta  = FT_Atan2( arc[3].x - start.x, arc[3].y - start.y );
              gamma = FT_Atan2( arc[0].x - end.x,   arc[0].y - end.y );

              bvec.x = end.x - start.x;
              bvec.y = end.y - start.y;

              blen = FT_Vector_Length( &bvec );

              sinA = ft_pos_abs( FT_Sin( alpha1 - gamma ) );
              sinB = ft_pos_abs( FT_Sin( beta - gamma ) );

              alen = FT_MulDiv( blen, sinA, sinB );

              FT_Vector_From_Polar( &delta, alen, beta );
              delta.x += start.x;
              delta.y += start.y;

              /* circumnavigate the negative sector backwards */
              border->movable = FALSE;
              error = ft_stroke_border_lineto( border, &delta, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_cubicto( border,
                                                &ctrl2,
                                                &ctrl1,
                                                &start );
              if ( error )
                goto Exit;
              /* and then move to the endpoint */
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;

              continue;
            }

            /* else fall through */
          }

          /* simply add an arc */
          error = ft_stroke_border_cubicto( border, &ctrl1, &ctrl2, &end );
          if ( error )
            goto Exit;
        }
      }

      arc -= 3;

      stroker->angle_in = angle_out;
    }

    stroker->center = *to;

  Exit:
    return error;
  }